

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

int __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::RandomHeight
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  uint32_t uVar1;
  int iVar2;
  
  iVar2 = 1;
  while( true ) {
    if (iVar2 == 0xc) {
      return iVar2;
    }
    uVar1 = Random::Next(&this->rnd_);
    if ((uVar1 & 3) != 0) break;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int SkipList<Key, Comparator>::RandomHeight() {
  // Increase height with probability 1 in kBranching
  static const unsigned int kBranching = 4;
  int height = 1;
  while (height < kMaxHeight && ((rnd_.Next() % kBranching) == 0)) {
    height++;
  }
  assert(height > 0);
  assert(height <= kMaxHeight);
  return height;
}